

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_storage.cpp
# Opt level: O0

int __thiscall
libtorrent::dht::anon_unknown_0::dht_default_storage::get_infohashes_sample
          (dht_default_storage *this,entry *item)

{
  int iVar1;
  entry *peVar2;
  size_type sVar3;
  digest32<160L> *p;
  size_type sVar4;
  string_view local_60;
  span<const_char> local_50;
  infohashes_sample *local_40;
  vector<sha1_hash> *samples;
  string_view local_28;
  entry *local_18;
  entry *item_local;
  dht_default_storage *this_local;
  
  local_18 = item;
  item_local = (entry *)this;
  iVar1 = libtorrent::aux::clamp<int>(this->m_settings->sample_infohashes_interval,0,0x5460);
  peVar2 = local_18;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"interval");
  peVar2 = entry::operator[](peVar2,local_28);
  entry::operator=(peVar2,(long)iVar1);
  sVar3 = std::
          map<libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::torrent_entry,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::torrent_entry>_>_>
          ::size(&this->m_map);
  peVar2 = local_18;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&samples,"num");
  peVar2 = entry::operator[](peVar2,_samples);
  entry::operator=(peVar2,(long)(int)sVar3);
  refresh_infohashes_sample(this);
  local_40 = &this->m_infohashes_sample;
  p = std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::data
                ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *
                 )local_40);
  sVar4 = std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
          size((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)
               local_40);
  span<const_char>::span(&local_50,(char *)p,sVar4 * 0x14);
  peVar2 = local_18;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,"samples");
  peVar2 = entry::operator[](peVar2,local_60);
  entry::operator=(peVar2,local_50);
  iVar1 = infohashes_sample::count(&this->m_infohashes_sample);
  return iVar1;
}

Assistant:

int get_infohashes_sample(entry& item) override
		{
			item["interval"] = aux::clamp(m_settings.sample_infohashes_interval
				, 0, sample_infohashes_interval_max);
			item["num"] = int(m_map.size());

			refresh_infohashes_sample();

			aux::vector<sha1_hash> const& samples = m_infohashes_sample.samples;
			item["samples"] = span<char const>(
				reinterpret_cast<char const*>(samples.data()), static_cast<std::ptrdiff_t>(samples.size()) * 20);

			return m_infohashes_sample.count();
		}